

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5yyStackOverflow(fts5yyParser *fts5yypParser)

{
  Fts5Parse *pParse;
  fts5YYMINORTYPE *in_RDX;
  fts5YYMINORTYPE *extraout_RDX;
  fts5yyStackEntry *pfVar1;
  
  pParse = fts5yypParser->pParse;
  pfVar1 = fts5yypParser->fts5yytos;
  while (fts5yypParser->fts5yystack < pfVar1) {
    fts5yypParser->fts5yytos = pfVar1 + -1;
    fts5yy_destructor((fts5yyParser *)(ulong)pfVar1->major,(char)pfVar1 + '\b',in_RDX);
    in_RDX = extraout_RDX;
    pfVar1 = fts5yypParser->fts5yytos;
  }
  sqlite3Fts5ParseError(pParse,"fts5: parser stack overflow");
  fts5yypParser->pParse = pParse;
  return;
}

Assistant:

static void fts5yyStackOverflow(fts5yyParser *fts5yypParser){
   sqlite3Fts5ParserARG_FETCH
   sqlite3Fts5ParserCTX_FETCH
#ifndef NDEBUG
   if( fts5yyTraceFILE ){
     fprintf(fts5yyTraceFILE,"%sStack Overflow!\n",fts5yyTracePrompt);
   }
#endif
   while( fts5yypParser->fts5yytos>fts5yypParser->fts5yystack ) fts5yy_pop_parser_stack(fts5yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3Fts5ParseError(pParse, "fts5: parser stack overflow");
/******** End %stack_overflow code ********************************************/
   sqlite3Fts5ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3Fts5ParserCTX_STORE
}